

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::duplicateRow
          (HighsPostsolveStack *this,HighsInt row,bool rowUpperTightened,bool rowLowerTightened,
          HighsInt duplicateRow,double duplicateRowScale)

{
  pointer piVar1;
  DuplicateRow local_20;
  
  piVar1 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_20.duplicateRow = piVar1[duplicateRow];
  local_20.row = piVar1[row];
  local_20.duplicateRowScale = duplicateRowScale;
  local_20.rowLowerTightened = rowLowerTightened;
  local_20.rowUpperTightened = rowUpperTightened;
  HighsDataStack::push<presolve::HighsPostsolveStack::DuplicateRow,_0>
            (&this->reductionValues,&local_20);
  reductionAdded(this,kDuplicateRow);
  return;
}

Assistant:

void duplicateRow(HighsInt row, bool rowUpperTightened,
                    bool rowLowerTightened, HighsInt duplicateRow,
                    double duplicateRowScale) {
    reductionValues.push(
        DuplicateRow{duplicateRowScale, origRowIndex[duplicateRow],
                     origRowIndex[row], rowLowerTightened, rowUpperTightened});
    reductionAdded(ReductionType::kDuplicateRow);
  }